

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpcfgs.cpp
# Opt level: O0

void usage(char *progname)

{
  ostream *poVar1;
  char *progname_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,progname);
  poVar1 = std::operator<<(poVar1," <Options> [CFG file A] [CFG file B]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Options:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -c               Compress CFGs (merge sequential nodes when possible)"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -p               Print detailed statistics for each CFG");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -s   Strategy    Comparission strategy, where Strategy is:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        simple: high level comparisson [default]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        specific: fine-grain comparisson");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -b               Consider only CFGs in both files");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -r   Range       Consider only CFGs in the range (start:end)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        can be used multiple times");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -a   Addr        Consider only CFGs with given address");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        can be used multiple times");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -A   File        Load file with addresses, one address per line");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        can be used multiple times");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -i   File        Instructions map (address:size:assembly per entry) file"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"   -o   File        Output statistics report file"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"   -d   Directory   Dump DOT cfgs in directory");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void usage(char* progname) {
	std::cout << "Usage: " << progname << " <Options> [CFG file A] [CFG file B]" << std::endl;
	std::cout << "Options:" << std::endl;
	std::cout << "   -c               Compress CFGs (merge sequential nodes when possible)" << std::endl;
	std::cout << "   -p               Print detailed statistics for each CFG" << std::endl;
	std::cout << "   -s   Strategy    Comparission strategy, where Strategy is:" << std::endl;
	std::cout << "                        simple: high level comparisson [default]" << std::endl;
	std::cout << "                        specific: fine-grain comparisson" << std::endl;
	std::cout << "   -b               Consider only CFGs in both files" << std::endl;
	std::cout << "   -r   Range       Consider only CFGs in the range (start:end)" << std::endl;
	std::cout << "                        can be used multiple times" << std::endl;
	std::cout << "   -a   Addr        Consider only CFGs with given address" << std::endl;
	std::cout << "                        can be used multiple times" << std::endl;
	std::cout << "   -A   File        Load file with addresses, one address per line" << std::endl;
	std::cout << "                        can be used multiple times" << std::endl;
	std::cout << "   -i   File        Instructions map (address:size:assembly per entry) file" << std::endl;
	std::cout << "   -o   File        Output statistics report file" << std::endl;
	std::cout << "   -d   Directory   Dump DOT cfgs in directory" << std::endl;
	std::cout << std::endl;

	exit(1);
}